

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int putVarint64(uchar *p,u64 v)

{
  long in_FS_OFFSET;
  int local_3c;
  int local_38;
  int n;
  int j;
  int i;
  u64 v_local;
  uchar *p_local;
  u8 buf [10];
  
  buf._2_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if ((v & 0xff00000000000000) == 0) {
    local_3c = 0;
    p_local._0_4_ = local_3c;
    _j = v;
    do {
      local_3c = (int)p_local;
      p_local._0_4_ = local_3c + 1;
      *(byte *)((long)&p_local + (long)local_3c + 6) = (byte)_j & 0x7f | 0x80;
      _j = _j >> 7;
    } while (_j != 0);
    p_local._6_1_ = p_local._6_1_ & 0x7f;
    n = 0;
    for (local_38 = local_3c; -1 < local_38; local_38 = local_38 + -1) {
      p[n] = *(uchar *)((long)&p_local + (long)local_38 + 6);
      n = n + 1;
    }
  }
  else {
    p[8] = (uchar)v;
    _j = v >> 8;
    for (n = 7; -1 < n; n = n + -1) {
      p[n] = (byte)_j & 0x7f | 0x80;
      _j = _j >> 7;
    }
    p_local._0_4_ = 9;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != buf._2_8_) {
    __stack_chk_fail();
  }
  return (int)p_local;
}

Assistant:

static int SQLITE_NOINLINE putVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}